

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# assembly_generator_x86.cpp
# Opt level: O3

void __thiscall
randomx::AssemblyGeneratorX86::h_IMULH_R(AssemblyGeneratorX86 *this,Instruction *instr,int i)

{
  undefined1 *puVar1;
  char *pcVar2;
  char cVar3;
  size_t sVar4;
  
  this->registerUsage[instr->dst] = i;
  puVar1 = &this->field_0x10;
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tmov rax, ",10);
  pcVar2 = *(char **)(regR + (ulong)instr->dst * 8);
  sVar4 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar4);
  cVar3 = (char)puVar1;
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tmul ",5);
  pcVar2 = *(char **)(regR + (ulong)instr->src * 8);
  sVar4 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar4);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,"\tmov ",5);
  pcVar2 = *(char **)(regR + (ulong)instr->dst * 8);
  sVar4 = strlen(pcVar2);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,pcVar2,sVar4);
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)puVar1,", rdx",5);
  std::ios::widen((char)*(undefined8 *)(*(long *)&this->field_0x10 + -0x18) + cVar3);
  std::ostream::put(cVar3);
  std::ostream::flush();
  return;
}

Assistant:

void AssemblyGeneratorX86::h_IMULH_R(Instruction& instr, int i) {
		registerUsage[instr.dst] = i;
		asmCode << "\tmov rax, " << regR[instr.dst] << std::endl;
		asmCode << "\tmul " << regR[instr.src] << std::endl;
		asmCode << "\tmov " << regR[instr.dst] << ", rdx" << std::endl;
		traceint(instr);
	}